

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall TPZManVector<TPZGraphEl_**,_10>::Shrink(TPZManVector<TPZGraphEl_**,_10> *this)

{
  ulong uVar1;
  TPZGraphEl ***pppTVar2;
  ulong uVar3;
  TPZGraphEl ***pppTVar4;
  int64_t i;
  
  uVar1 = (this->super_TPZVec<TPZGraphEl_**>).fNElements;
  if (10 < (long)uVar1) {
    if ((this->super_TPZVec<TPZGraphEl_**>).fNAlloc == uVar1) {
      return;
    }
    uVar3 = 0;
    pppTVar4 = (TPZGraphEl ***)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    pppTVar2 = (this->super_TPZVec<TPZGraphEl_**>).fStore;
    do {
      pppTVar4[uVar3] = pppTVar2[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    operator_delete__(pppTVar2);
    (this->super_TPZVec<TPZGraphEl_**>).fStore = pppTVar4;
    (this->super_TPZVec<TPZGraphEl_**>).fNAlloc = (this->super_TPZVec<TPZGraphEl_**>).fNElements;
    return;
  }
  pppTVar4 = (this->super_TPZVec<TPZGraphEl_**>).fStore;
  pppTVar2 = this->fExtAlloc;
  if (pppTVar4 == pppTVar2) {
    return;
  }
  if ((long)uVar1 < 1) {
    if (pppTVar4 == (TPZGraphEl ***)0x0) goto LAB_012938e2;
  }
  else {
    uVar3 = 0;
    do {
      pppTVar2[uVar3] = pppTVar4[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  operator_delete__(pppTVar4);
LAB_012938e2:
  (this->super_TPZVec<TPZGraphEl_**>).fStore = pppTVar2;
  (this->super_TPZVec<TPZGraphEl_**>).fNAlloc = 10;
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}